

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
 fmt::v7::detail::
 write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>
           (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            out,decimal_fp<double> *fp,basic_format_specs<char> *specs,float_specs fspecs,
           char decimal_point)

{
  uint uVar1;
  size_type sVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  bVar7;
  size_t sVar8;
  ulong uVar9;
  significand_type *psVar10;
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  char cVar11;
  ulong uVar12;
  pointer __s;
  pointer pcVar13;
  int iVar14;
  long lVar15;
  pointer pcVar16;
  sign_t sVar17;
  significand_type *psVar18;
  int iVar19;
  long lVar20;
  int num_zeros;
  sign_t sign;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_40_7_ef14d3db write;
  undefined1 local_8d [5];
  sign_t local_88;
  int local_84;
  significand_type *local_80;
  undefined1 local_74 [12];
  anon_class_56_7_a2a26a24 local_68;
  
  psVar10 = (significand_type *)fp->significand;
  lVar20 = 0x3f;
  if (((ulong)psVar10 | 1) != 0) {
    for (; ((ulong)psVar10 | 1) >> lVar20 == 0; lVar20 = lVar20 + -1) {
    }
  }
  lVar20 = (ulong)*(ushort *)(bsr2log10(int)::data + (uint)((int)lVar20 * 2)) -
           (ulong)(psVar10 <
                  *(significand_type **)
                   (basic_data<void>::zero_or_powers_of_10_64_new +
                   (ulong)*(ushort *)(bsr2log10(int)::data + (uint)((int)lVar20 * 2)) * 8));
  iVar19 = (int)lVar20;
  uVar4 = fspecs._4_4_;
  sVar17 = uVar4 >> 8 & 0xff;
  uVar9 = (ulong)((iVar19 + 1) - (uint)(sVar17 == none));
  uVar1 = fp->exponent;
  local_74._0_4_ = uVar1 + iVar19;
  iVar5 = fspecs.precision;
  local_8d[0] = decimal_point;
  local_88 = sVar17;
  local_84 = iVar19;
  local_80 = psVar10;
  local_74._4_8_ = fspecs;
  if (fspecs._4_1_ == '\x01') {
LAB_00115a86:
    iVar14 = uVar1 + iVar19 + -1;
    if ((uVar4 >> 0x14 & 1) == 0) {
      uVar6 = 0;
      uVar12 = (ulong)(byte)decimal_point;
      if (iVar19 == 1) {
        uVar12 = uVar6;
      }
      cVar11 = (char)uVar12;
    }
    else {
      uVar6 = 0;
      if (0 < iVar5 - iVar19) {
        uVar6 = (ulong)(uint)(iVar5 - iVar19);
      }
      uVar9 = uVar9 + uVar6;
      cVar11 = decimal_point;
    }
    iVar5 = 1 - local_74._0_4_;
    if (0 < (int)local_74._0_4_) {
      iVar5 = iVar14;
    }
    lVar15 = 2;
    if (99 < iVar5) {
      lVar15 = (ulong)(999 < iVar5) + 3;
    }
    sVar8 = (3 - (ulong)(cVar11 == '\0')) + uVar9 + lVar15;
    local_68.sign = (sign_t *)(CONCAT44(local_68.sign._4_4_,uVar4 >> 8) & 0xffffffff000000ff);
    local_68.significand_size._0_5_ = CONCAT14(cVar11,iVar19);
    local_68.fp = (decimal_fp<double> *)
                  (CONCAT35(local_68.fp._5_3_,CONCAT14(((uVar4 >> 0x10 & 1) == 0) << 5,(int)uVar6))
                  | 0x4500000000);
    local_68.fspecs = (float_specs *)CONCAT44(local_68.fspecs._4_4_,iVar14);
    local_68.significand = psVar10;
    if (0 < specs->width) {
      bVar7 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_1_&>
                        (out,specs,sVar8,sVar8,(anon_class_40_7_ef14d3db *)&local_68);
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )bVar7.container;
    }
    sVar2 = (out.container)->_M_string_length;
    std::__cxx11::string::resize((ulong)out.container,(char)sVar8 + (char)sVar2);
    pcVar16 = ((out.container)->_M_dataplus)._M_p + sVar2;
    if (sVar17 != none) {
      *pcVar16 = *(char *)((long)&basic_data<void>::signs + (ulong)sVar17);
      pcVar16 = pcVar16 + 1;
    }
    if (cVar11 == '\0') {
      __s = pcVar16 + lVar20;
      pcVar16 = __s;
      psVar18 = psVar10;
      if ((significand_type *)0x63 < psVar10) {
        do {
          psVar10 = (significand_type *)((ulong)psVar18 / 100);
          *(undefined2 *)(pcVar16 + -2) =
               *(undefined2 *)(basic_data<void>::digits + ((ulong)psVar18 % 100) * 2);
          pcVar16 = pcVar16 + -2;
          bVar3 = (significand_type *)0x270f < psVar18;
          psVar18 = psVar10;
        } while (bVar3);
      }
      if (psVar10 < (significand_type *)0xa) {
        pcVar16[-1] = (byte)psVar10 | 0x30;
      }
      else {
        *(undefined2 *)(pcVar16 + -2) =
             *(undefined2 *)(basic_data<void>::digits + (long)psVar10 * 2);
      }
    }
    else {
      __s = pcVar16 + (long)iVar19 + 1;
      pcVar13 = __s;
      psVar18 = psVar10;
      if ((significand_type *)0x63 < psVar10) {
        do {
          psVar10 = (significand_type *)((ulong)psVar18 / 100);
          *(undefined2 *)(pcVar13 + -2) =
               *(undefined2 *)(basic_data<void>::digits + ((ulong)psVar18 % 100) * 2);
          pcVar13 = pcVar13 + -2;
          bVar3 = (significand_type *)0x270f < psVar18;
          psVar18 = psVar10;
        } while (bVar3);
      }
      if (psVar10 < (significand_type *)0xa) {
        pcVar13[-1] = (byte)psVar10 | 0x30;
      }
      else {
        *(undefined2 *)(pcVar13 + -2) =
             *(undefined2 *)(basic_data<void>::digits + (long)psVar10 * 2);
      }
      *pcVar16 = pcVar16[1];
      pcVar16[1] = cVar11;
    }
    __n = (size_t)(int)local_68.fp;
    pcVar16 = __s;
    if (0 < (long)__n) {
      pcVar16 = __s + __n;
      memset(__s,0x30,__n);
    }
    *pcVar16 = local_68.fp._4_1_;
    write_exponent<char,char*>((int)local_68.fspecs,pcVar16 + 1);
    return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )out.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar14 = 0x10;
    if (0 < iVar5) {
      iVar14 = iVar5;
    }
    if (((int)local_74._0_4_ < -3) || (iVar14 < (int)local_74._0_4_)) goto LAB_00115a86;
  }
  if ((int)uVar1 < 0) {
    if (0 < (int)local_74._0_4_) {
      local_8d._1_4_ = iVar5 - iVar19 & (int)(uVar4 << 0xb) >> 0x1f;
      local_68.decimal_point = local_8d + 1;
      uVar6 = (ulong)(uint)local_8d._1_4_;
      if ((int)local_8d._1_4_ < 1) {
        uVar6 = 0;
      }
      sVar8 = uVar6 + 1 + uVar9;
      local_68.sign = &local_88;
      local_68.significand = (significand_type *)&local_80;
      local_68.significand_size = &local_84;
      local_68.fp = (decimal_fp<double> *)local_74;
      local_68.fspecs = (float_specs *)local_8d;
      bVar7 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_3_&>
                        (out,specs,sVar8,sVar8,(anon_class_48_6_48d028d1 *)&local_68);
      return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )bVar7.container;
    }
    iVar14 = -local_74._0_4_;
    local_8d._1_4_ = iVar14;
    if (SBORROW4(iVar5,iVar14) != iVar5 + local_74._0_4_ < 0) {
      local_8d._1_4_ = iVar5;
    }
    if (iVar5 < 0) {
      local_8d._1_4_ = iVar14;
    }
    if (iVar19 != 0) {
      local_8d._1_4_ = iVar14;
    }
    local_68.significand = (significand_type *)(local_8d + 1);
    sVar8 = (local_8d._1_4_ + 2) + uVar9;
    local_68.sign = &local_88;
    local_68.significand_size = &local_84;
    local_68.fp = (decimal_fp<double> *)(local_74 + 4);
    local_68.fspecs = (float_specs *)local_8d;
    local_68.decimal_point = (char *)&local_80;
    bVar7 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_4_&>
                      (out,specs,sVar8,sVar8,(anon_class_48_6_9afe1116 *)&local_68);
    return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            )bVar7.container;
  }
  sVar8 = uVar9 + uVar1;
  local_8d._1_4_ = iVar5 - local_74._0_4_;
  if ((uVar4 >> 0x14 & 1) != 0) {
    if ((fspecs._4_1_ == '\x02') || (0 < (int)local_8d._1_4_)) {
      if ((int)local_8d._1_4_ < 1) goto LAB_00115c47;
    }
    else {
      local_8d._1_4_ = 1;
    }
    sVar8 = sVar8 + (uint)local_8d._1_4_;
  }
LAB_00115c47:
  local_68.sign = &local_88;
  local_68.significand = (significand_type *)&local_80;
  local_68.significand_size = &local_84;
  local_68.fspecs = (float_specs *)(local_74 + 4);
  local_68.decimal_point = local_8d;
  local_68.num_zeros = (int *)(local_8d + 1);
  local_68.fp = fp;
  bVar7 = write_padded<(fmt::v7::align::type)2,std::back_insert_iterator<std::__cxx11::string>,char,fmt::v7::detail::write_float<std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>,char>(std::back_insert_iterator<std::__cxx11::string>,fmt::v7::detail::dragonbox::decimal_fp<double>const&,fmt::v7::basic_format_specs<char>const&,fmt::v7::detail::float_specs,char)::_lambda(char*)_2_&>
                    (out,specs,sVar8,sVar8,&local_68);
  return (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )bVar7.container;
}

Assistant:

OutputIt write_float(OutputIt out, const DecimalFP& fp,
                     const basic_format_specs<Char>& specs, float_specs fspecs,
                     Char decimal_point) {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = (std::max)(fspecs.precision - significand_size, 0);
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = std::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = std::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? std::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  size += 2 + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (num_zeros == 0 && significand_size == 0 && !fspecs.showpoint) return it;
    *it++ = decimal_point;
    it = std::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}